

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_wrapper.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::
container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
::container_wrapper(container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                    *this,array<libtorrent::str_setting_entry_t,_13UL> *b)

{
  ::std::array<libtorrent::str_setting_entry_t,_13UL>::array
            (&this->super_array<libtorrent::str_setting_entry_t,_13UL>,b);
  return;
}

Assistant:

constexpr explicit container_wrapper(Base&& b) noexcept : Base(std::move(b)) {}